

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O0

int file_write(int hdl,void *buffer,long nbytes)

{
  int iVar1;
  size_t sVar2;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  int local_4;
  
  if ((handleTable[in_EDI].last_io_op == 1) && (iVar1 = file_seek((int)in_RSI,in_RDX), iVar1 != 0))
  {
    local_4 = 0x74;
  }
  else {
    sVar2 = fwrite(in_RSI,1,in_RDX,(FILE *)handleTable[in_EDI].fileptr);
    if (sVar2 == in_RDX) {
      handleTable[in_EDI].currentpos = in_RDX + handleTable[in_EDI].currentpos;
      handleTable[in_EDI].last_io_op = 2;
      local_4 = 0;
    }
    else {
      local_4 = 0x6a;
    }
  }
  return local_4;
}

Assistant:

int file_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{
    if (handleTable[hdl].last_io_op == IO_READ) 
    {
        if (file_seek(hdl, handleTable[hdl].currentpos))
            return(SEEK_ERROR);
    }

    if((long) fwrite(buffer, 1, nbytes, handleTable[hdl].fileptr) != nbytes)
        return(WRITE_ERROR);

    handleTable[hdl].currentpos += nbytes;
    handleTable[hdl].last_io_op = IO_WRITE;
    return(0);
}